

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O3

void __thiscall
CheckedMutexTest_InvalidUnlock0_Test<yamc::checked::timed_mutex>::TestBody
          (CheckedMutexTest_InvalidUnlock0_Test<yamc::checked::timed_mutex> *this)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var2;
  bool bVar3;
  char cVar4;
  int iVar5;
  char *pcVar6;
  StringLike<const_char_*> *regex;
  DeathTest *gtest_dt;
  TypeParam mtx;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d0;
  AssertHelper local_c8;
  PolymorphicMatcher<testing::internal::MatchesRegexMatcher> local_c0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_a0;
  mutex_base local_88;
  
  yamc::checked::timed_mutex::timed_mutex((timed_mutex *)&local_88);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_c8.data_ = (AssertHelperData *)0x1cec69;
    testing::ContainsRegex<char_const*>(&local_c0,(testing *)&local_c8,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_a0,(PolymorphicMatcher *)&local_c0);
    if (local_c0.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("mtx.unlock()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_a0,
                       "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
                       ,0x60,(DeathTest **)&local_d0);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_a0);
    _Var1._M_head_impl = local_d0._M_head_impl;
    if (!bVar3) goto LAB_00176e8d;
    if ((element_type *)local_d0._M_head_impl == (element_type *)0x0) goto LAB_00176ee3;
    iVar5 = (**(code **)(*(long *)local_d0._M_head_impl + 0x10))(local_d0._M_head_impl);
    _Var2._M_head_impl = local_d0._M_head_impl;
    if (iVar5 == 0) {
      testing::KilledBySignal::KilledBySignal((KilledBySignal *)&local_c0,6);
      iVar5 = (**(code **)(*(char **)&(local_d0._M_head_impl)->field_0x0 + 0x18))();
      bVar3 = testing::KilledBySignal::operator()((KilledBySignal *)&local_c0,iVar5);
      cVar4 = (**(code **)(*(long *)_Var2._M_head_impl + 0x20))(_Var2._M_head_impl,bVar3);
      if (cVar4 == '\0') {
        (**(code **)(*(long *)_Var1._M_head_impl + 8))(_Var1._M_head_impl);
        goto LAB_00176e8d;
      }
    }
    else if (iVar5 == 1) {
      bVar3 = testing::internal::AlwaysTrue();
      if (bVar3) {
        yamc::checked::detail::mutex_base::unlock(&local_88);
      }
      (**(code **)(*(char **)&(local_d0._M_head_impl)->field_0x0 + 0x28))(local_d0._M_head_impl,2);
      (**(code **)(*(long *)_Var2._M_head_impl + 0x28))(_Var2._M_head_impl,0);
    }
    pcVar6 = *(char **)_Var1._M_head_impl;
    local_c0.impl_.regex_.
    super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var1._M_head_impl;
  }
  else {
LAB_00176e8d:
    testing::Message::Message((Message *)&local_c0);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0x60,pcVar6);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_c0.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) goto LAB_00176ee3;
    pcVar6 = (local_c0.impl_.regex_.
              super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             pattern_;
  }
  (**(code **)(pcVar6 + 8))
            (local_c0.impl_.regex_.
             super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
LAB_00176ee3:
  yamc::checked::timed_mutex::~timed_mutex((timed_mutex *)&local_88);
  return;
}

Assistant:

TYPED_TEST(CheckedMutexTest, InvalidUnlock0) {
  TypeParam mtx;
  EXPECT_CHECK_FAILURE(mtx.unlock());
}